

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

bool deqp::gls::pixelNeighborhoodContainsColor
               (Surface *target,int x,int y,RGBA *color,IVec3 *compareThreshold)

{
  bool bVar1;
  int iVar2;
  int dx;
  int iVar3;
  RGBA targetCmpPixel;
  
  for (iVar2 = -1; iVar2 != 2; iVar2 = iVar2 + 1) {
    iVar3 = -1;
    while (iVar3 != 2) {
      bVar1 = colorsEqual(color,&targetCmpPixel,compareThreshold);
      iVar3 = iVar3 + 1;
      if (bVar1) goto LAB_006e1180;
    }
  }
LAB_006e1180:
  return iVar2 < 2;
}

Assistant:

static bool pixelNeighborhoodContainsColor (const tcu::Surface& target, int x, int y, const tcu::RGBA& color, const tcu::IVec3& compareThreshold)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const tcu::RGBA	targetCmpPixel = target.getPixel(x+dx, y+dy);
		if (colorsEqual(color, targetCmpPixel, compareThreshold))
			return true;
	}

	return false;
}